

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::AddCommand(cmState *this,cmCommand *command)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_b0;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Self local_78;
  _Self local_70;
  iterator pos;
  string local_58;
  undefined1 local_38 [8];
  string name;
  cmCommand *command_local;
  cmState *this_local;
  
  name.field_2._8_8_ = command;
  (*(command->super_cmObject)._vptr_cmObject[0xc])();
  cmsys::SystemTools::LowerCase((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::find(&this->Commands,(key_type *)local_38);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::end(&this->Commands);
  bVar1 = std::operator!=(&local_70,&local_78);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>
             ::operator->(&local_70);
    if (ppVar2->second != (cmCommand *)0x0) {
      (*(ppVar2->second->super_cmObject)._vptr_cmObject[1])();
    }
    local_80 = local_70._M_node;
    local_88 = (_Base_ptr)
               std::
               map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
               ::erase_abi_cxx11_((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                                   *)&this->Commands,local_70._M_node);
  }
  std::make_pair<std::__cxx11::string&,cmCommand*&>
            (&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
             ,(cmCommand **)((long)&name.field_2 + 8));
  std::
  map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
  ::insert<std::pair<std::__cxx11::string,cmCommand*>>
            ((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
              *)&this->Commands,&local_b0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  ::~pair(&local_b0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmState::AddCommand(cmCommand* command)
{
  std::string name = cmSystemTools::LowerCase(command->GetName());
  // if the command already exists, free the old one
  std::map<std::string, cmCommand*>::iterator pos = this->Commands.find(name);
  if (pos != this->Commands.end())
    {
    delete pos->second;
    this->Commands.erase(pos);
    }
  this->Commands.insert(std::make_pair(name, command));
}